

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O1

void visit_label_stmt(gvisitor_t *self,gnode_label_stmt_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  uint32_t lineno;
  
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  gVar1 = (node->base).token.type;
  if ((gVar1 != TOK_KEY_DEFAULT) && (gVar1 != TOK_KEY_CASE)) {
    __assert_fail("(type == TOK_KEY_DEFAULT) || (type == TOK_KEY_CASE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x18e,"void visit_label_stmt(gvisitor_t *, gnode_label_stmt_t *)");
  }
  if (node == (gnode_label_stmt_t *)0x0) {
    lineno = 0;
  }
  else {
    lineno = (node->base).token.lineno;
  }
  ircode_marklabel((ircode_t *)plVar2[0x14],node->label_case,lineno);
  gvisit(self,node->stmt);
  return;
}

Assistant:

static void visit_label_stmt (gvisitor_t *self, gnode_label_stmt_t *node) {
    DEBUG_SEMA2("visit_label_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    if (!TOP_STATEMENT_ISA_SWITCH()) {
        if (type == TOK_KEY_DEFAULT) REPORT_ERROR(node, "'default' statement not in switch statement.");
        if (type == TOK_KEY_CASE) REPORT_ERROR(node, "'case' statement not in switch statement.");
    }

    if (type == TOK_KEY_DEFAULT) {visit(node->stmt);}
    else if (type == TOK_KEY_CASE) {visit(node->expr); visit(node->stmt);}
}